

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
FuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::buildTest(FuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this)

{
  Statement *stmt;
  StatementP local_190;
  undefined1 local_180 [8];
  ExprP<tcu::Vector<float,_2>_> expr;
  string local_168;
  VariableP<vkt::shaderexecutor::Void> local_148;
  allocator<char> local_131;
  string local_130;
  VariableP<vkt::shaderexecutor::Void> local_110;
  allocator<char> local_f9;
  string local_f8;
  VariableP<vkt::shaderexecutor::Void> local_d8;
  allocator<char> local_c1;
  string local_c0;
  VariableP<tcu::Vector<float,_2>_> local_a0;
  allocator<char> local_89;
  string local_88;
  VariableP<vkt::shaderexecutor::Void> local_68 [2];
  allocator<char> local_41;
  string local_40;
  VariableP<tcu::Vector<float,_2>_> local_20;
  FuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_10;
  FuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out0",&local_41);
  variable<tcu::Vector<float,2>>((shaderexecutor *)&local_20,&local_40);
  VariableP<tcu::Vector<float,_2>_>::operator=(&(this->m_variables).out0,&local_20);
  VariableP<tcu::Vector<float,_2>_>::~VariableP(&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"out1",&local_89);
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)local_68,&local_88);
  VariableP<vkt::shaderexecutor::Void>::operator=(&(this->m_variables).out1,local_68);
  VariableP<vkt::shaderexecutor::Void>::~VariableP(local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"in0",&local_c1);
  variable<tcu::Vector<float,2>>((shaderexecutor *)&local_a0,&local_c0);
  VariableP<tcu::Vector<float,_2>_>::operator=(&(this->m_variables).in0,&local_a0);
  VariableP<tcu::Vector<float,_2>_>::~VariableP(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"in1",&local_f9);
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_d8,&local_f8);
  VariableP<vkt::shaderexecutor::Void>::operator=(&(this->m_variables).in1,&local_d8);
  VariableP<vkt::shaderexecutor::Void>::~VariableP(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"in2",&local_131);
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_110,&local_130);
  VariableP<vkt::shaderexecutor::Void>::operator=(&(this->m_variables).in2,&local_110);
  VariableP<vkt::shaderexecutor::Void>::~VariableP(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"in3",
             (allocator<char> *)
             ((long)&expr.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
                     super_ExprPBase<tcu::Vector<float,_2>_>.
                     super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.
                     m_state + 7));
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_148,&local_168);
  VariableP<vkt::shaderexecutor::Void>::operator=(&(this->m_variables).in3,&local_148);
  VariableP<vkt::shaderexecutor::Void>::~VariableP(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expr.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
                     super_ExprPBase<tcu::Vector<float,_2>_>.
                     super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.
                     m_state + 7));
  applyVar<vkt::shaderexecutor::Signature<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((shaderexecutor *)local_180,this->m_func,&(this->m_variables).in0,
             &(this->m_variables).in1,&(this->m_variables).in2,&(this->m_variables).in3);
  variableAssignment<tcu::Vector<float,2>>
            ((shaderexecutor *)&local_190,&(this->m_variables).out0,
             (ExprP<tcu::Vector<float,_2>_> *)local_180);
  StatementP::operator=(&(this->super_FuncCaseBase).m_stmt,&local_190);
  StatementP::~StatementP(&local_190);
  stmt = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator*
                   (&(this->super_FuncCaseBase).m_stmt.
                     super_SharedPtr<const_vkt::shaderexecutor::Statement>);
  PrecisionCase::
  testStatement<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>,vkt::shaderexecutor::OutTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void>>
            ((PrecisionCase *)this,&this->m_variables,stmt);
  ExprP<tcu::Vector<float,_2>_>::~ExprP((ExprP<tcu::Vector<float,_2>_> *)local_180);
  return;
}

Assistant:

void FuncCase<Sig>::buildTest (void)
{
	m_variables.out0	= variable<Ret>("out0");
	m_variables.out1	= variable<Void>("out1");
	m_variables.in0		= variable<Arg0>("in0");
	m_variables.in1		= variable<Arg1>("in1");
	m_variables.in2		= variable<Arg2>("in2");
	m_variables.in3		= variable<Arg3>("in3");

	{
		ExprP<Ret> expr	= applyVar(m_func, m_variables.in0, m_variables.in1, m_variables.in2, m_variables.in3);
		m_stmt			= variableAssignment(m_variables.out0, expr);

		this->testStatement(m_variables, *m_stmt);
	}
}